

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

wchar_t * StringFromUnits(LengthUnitSystem units)

{
  if ((byte)(units - Microns) < 0x19) {
    return (wchar_t *)(&DAT_006eb7a0 + *(int *)(&DAT_006eb7a0 + (ulong)(byte)(units - Microns) * 4))
    ;
  }
  return L"none";
}

Assistant:

static const wchar_t* StringFromUnits(ON::LengthUnitSystem units)
{
  // These strings appear in the XML -- do not change them.

  switch (units)
  {
  case ON::LengthUnitSystem::Angstroms:         return L"angstroms";
  case ON::LengthUnitSystem::AstronomicalUnits: return L"astronomical";
  case ON::LengthUnitSystem::Centimeters:       return L"centimeters";
  case ON::LengthUnitSystem::Decimeters:        return L"decimeters";
  case ON::LengthUnitSystem::Dekameters:        return L"dekameters";
  case ON::LengthUnitSystem::Feet:              return L"feet";
  case ON::LengthUnitSystem::Gigameters:        return L"gigameters";
  case ON::LengthUnitSystem::Hectometers:       return L"hectometers";
  case ON::LengthUnitSystem::Inches:            return L"inches";
  case ON::LengthUnitSystem::Kilometers:        return L"kilometers";
  case ON::LengthUnitSystem::LightYears:        return L"lightyears";
  case ON::LengthUnitSystem::Megameters:        return L"megameters";
  case ON::LengthUnitSystem::Meters:            return L"meters";
  case ON::LengthUnitSystem::Microinches:       return L"microinches";
  case ON::LengthUnitSystem::Microns:           return L"microns";
  case ON::LengthUnitSystem::Miles:             return L"miles";
  case ON::LengthUnitSystem::Millimeters:       return L"millimeters";
  case ON::LengthUnitSystem::Mils:              return L"mils";
  case ON::LengthUnitSystem::Nanometers:        return L"nanometers";
  case ON::LengthUnitSystem::NauticalMiles:     return L"nautical-miles";
  case ON::LengthUnitSystem::Parsecs:           return L"parsecs";
  case ON::LengthUnitSystem::Yards:             return L"yards";
    default:
        break;
  }

  return L"none";
}